

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O3

fio_str_info_s *
fio_str_concat(fio_str_info_s *__return_storage_ptr__,fio_str_s *dest,fio_str_s *src)

{
  undefined8 in_RAX;
  uint64_t uVar1;
  ulong uVar2;
  fio_str_info_s *pfVar3;
  char *pcVar4;
  size_t sVar5;
  uint8_t *puVar6;
  uint8_t *__src;
  ulong uVar7;
  fio_str_info_s local_40;
  
  if (src == (fio_str_s *)0x0 || dest == (fio_str_s *)0x0) {
    if (dest == (fio_str_s *)0x0) {
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = 0;
      __return_storage_ptr__->data = (char *)0x0;
      return (fio_str_info_s *)CONCAT71((int7)((ulong)in_RAX >> 8),dest == (fio_str_s *)0x0);
    }
  }
  else if (dest->frozen == '\0') {
    if ((src->small == 0) && (__src = (uint8_t *)src->data, __src != (uint8_t *)0x0)) {
      uVar1 = src->len;
    }
    else {
      uVar1 = (uint64_t)(src->small >> 1);
      __src = src->reserved;
    }
    if (uVar1 == 0) {
      uVar7 = (ulong)dest->small;
      if ((uVar7 == 0) && (pcVar4 = dest->data, pcVar4 != (char *)0x0)) {
        uVar1 = dest->len;
        __return_storage_ptr__->capa = dest->capa;
        __return_storage_ptr__->len = uVar1;
        pfVar3 = (fio_str_info_s *)0x0;
        goto LAB_0013ed23;
      }
      __return_storage_ptr__->capa = 0x29;
      goto LAB_0013ec75;
    }
    if (dest->small == 0) {
      uVar7 = uVar1;
      if (dest->data == (char *)0x0) goto LAB_0013ecce;
      uVar7 = dest->len + uVar1;
      uVar2 = dest->capa;
      if (uVar2 <= uVar7) {
        if (dest->dealloc == (_func_void_void_ptr *)0x0) {
          uVar2 = dest->len;
        }
        dest->len = uVar2;
        goto LAB_0013ed64;
      }
    }
    else {
      uVar7 = (dest->small >> 1) + uVar1;
LAB_0013ecce:
      if (uVar7 < 0x2a) {
        dest->small = (char)uVar7 * '\x02' + '\x01';
        dest->reserved[uVar7] = '\0';
        puVar6 = dest->reserved;
        __return_storage_ptr__->capa = 0x29;
        __return_storage_ptr__->len = uVar7;
        goto LAB_0013ed90;
      }
      dest->small = 'S';
LAB_0013ed64:
      fio_str_capa_assert(&local_40,dest,uVar7);
    }
    dest->len = uVar7;
    dest->data[uVar7] = '\0';
    __return_storage_ptr__->capa = dest->capa;
    __return_storage_ptr__->len = uVar7;
    puVar6 = (uint8_t *)dest->data;
LAB_0013ed90:
    __return_storage_ptr__->data = (char *)puVar6;
    pfVar3 = (fio_str_info_s *)memcpy(puVar6 + (uVar7 - uVar1),__src,uVar1);
    return pfVar3;
  }
  uVar7 = (ulong)dest->small;
  if ((uVar7 == 0) && (pcVar4 = dest->data, pcVar4 != (char *)0x0)) {
    if (dest->frozen == '\0') {
      uVar1 = dest->capa;
    }
    else {
      uVar1 = 0;
    }
    __return_storage_ptr__->capa = uVar1;
    pfVar3 = (fio_str_info_s *)dest->len;
    __return_storage_ptr__->len = (size_t)pfVar3;
LAB_0013ed23:
    __return_storage_ptr__->data = pcVar4;
    return pfVar3;
  }
  sVar5 = 0x29;
  if (dest->frozen != '\0') {
    sVar5 = 0;
  }
  __return_storage_ptr__->capa = sVar5;
LAB_0013ec75:
  __return_storage_ptr__->len = (size_t)(uVar7 >> 1);
  __return_storage_ptr__->data = (char *)dest->reserved;
  return (fio_str_info_s *)(uVar7 >> 1);
}

Assistant:

inline FIO_FUNC fio_str_info_s fio_str_concat(fio_str_s *dest,
                                              fio_str_s const *src) {
  if (!dest || !src || dest->frozen)
    return fio_str_info(dest);
  fio_str_info_s src_state = fio_str_info(src);
  if (!src_state.len)
    return fio_str_info(dest);
  fio_str_info_s state =
      fio_str_resize(dest, src_state.len + fio_str_len(dest));
  memcpy(state.data + state.len - src_state.len, src_state.data, src_state.len);
  return state;
}